

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O3

void FAudio_INTERNAL_Amplify_SSE2(float *output,uint32_t totalSamples,float volume)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar8 = 0x10 - ((uint)output & 0xf) >> 2;
  uVar6 = 0;
  if (uVar8 != 4) {
    uVar6 = uVar8;
  }
  uVar7 = (ulong)uVar6;
  if (uVar6 != 0) {
    uVar9 = 0;
    do {
      output[uVar9] = output[uVar9] * volume;
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
  uVar8 = totalSamples - (totalSamples - uVar8 & 3);
  while (uVar6 < uVar8) {
    pfVar1 = output + uVar7;
    fVar3 = pfVar1[1];
    fVar4 = pfVar1[2];
    fVar5 = pfVar1[3];
    pfVar2 = output + uVar7;
    *pfVar2 = *pfVar1 * volume;
    pfVar2[1] = fVar3 * volume;
    pfVar2[2] = fVar4 * volume;
    pfVar2[3] = fVar5 * volume;
    uVar6 = (int)uVar7 + 4;
    uVar7 = (ulong)uVar6;
  }
  if (uVar8 < totalSamples) {
    uVar7 = (ulong)uVar8;
    do {
      output[uVar7] = output[uVar7] * volume;
      uVar7 = uVar7 + 1;
    } while (totalSamples != uVar7);
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Amplify_SSE2(
	float* output,
	uint32_t totalSamples,
	float volume
) {
	uint32_t i;
	uint32_t header = (16 - (((size_t) output) % 16)) / 4;
	uint32_t tail = (totalSamples - header) % 4;
	__m128 volumeVec, outVec;
	if (header == 4)
	{
		header = 0;
	}
	if (tail == 4)
	{
		tail = 0;
	}

	for (i = 0; i < header; i += 1)
	{
		output[i] *= volume;
	}

	volumeVec = _mm_set1_ps(volume);
	for (i = header; i < totalSamples - tail; i += 4)
	{
		outVec = _mm_load_ps(output + i);
		outVec = _mm_mul_ps(outVec, volumeVec);
		_mm_store_ps(output + i, outVec);
	}

	for (i = totalSamples - tail; i < totalSamples; i += 1)
	{
		output[i] *= volume;
	}
}